

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExprWriter.cpp
# Opt level: O3

void __thiscall ExprWriter::visit(ExprWriter *this,AsmExpr *expr)

{
  pointer ppVar1;
  size_type sVar2;
  char cVar3;
  bool bVar4;
  ostream *poVar5;
  iterator __begin2;
  pointer ppVar6;
  iterator __begin2_1;
  
  poVar5 = this->ss;
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"__asm__(\"",9);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,(expr->inst)._M_dataplus._M_p,(expr->inst)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\"",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  this->indentCount = this->indentCount + 1;
  indent(this);
  std::__ostream_insert<char,std::char_traits<char>>(this->ss,": ",2);
  ppVar6 = (expr->output).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (expr->output).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar6 != ppVar1) {
    bVar4 = true;
    do {
      if (ppVar6->second == (Expr *)0x0) break;
      if (!bVar4) {
        std::__ostream_insert<char,std::char_traits<char>>(this->ss,", ",2);
      }
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (this->ss,(ppVar6->first)._M_dataplus._M_p,(ppVar6->first)._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," (",2);
      (*ppVar6->second->_vptr_Expr[2])(ppVar6->second,this);
      std::__ostream_insert<char,std::char_traits<char>>(this->ss,")",1);
      ppVar6 = ppVar6 + 1;
      bVar4 = false;
    } while (ppVar6 != ppVar1);
  }
  cVar3 = (char)this->ss;
  std::ios::widen((char)*(undefined8 *)(*(long *)this->ss + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  indent(this);
  std::__ostream_insert<char,std::char_traits<char>>(this->ss,": ",2);
  ppVar6 = (expr->input).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (expr->input).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Expr_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar6 != ppVar1) {
    bVar4 = true;
    do {
      if (!bVar4) {
        std::__ostream_insert<char,std::char_traits<char>>(this->ss,", ",2);
      }
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (this->ss,(ppVar6->first)._M_dataplus._M_p,(ppVar6->first)._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," (",2);
      (*ppVar6->second->_vptr_Expr[2])(ppVar6->second,this);
      std::__ostream_insert<char,std::char_traits<char>>(this->ss,")",1);
      ppVar6 = ppVar6 + 1;
      bVar4 = false;
    } while (ppVar6 != ppVar1);
  }
  cVar3 = (char)this->ss;
  std::ios::widen((char)*(undefined8 *)(*(long *)this->ss + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  indent(this);
  std::__ostream_insert<char,std::char_traits<char>>(this->ss,": ",2);
  sVar2 = (expr->clobbers)._M_string_length;
  if (sVar2 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              (this->ss,(expr->clobbers)._M_dataplus._M_p,sVar2);
  }
  cVar3 = (char)this->ss;
  std::ios::widen((char)*(undefined8 *)(*(long *)this->ss + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  this->indentCount = this->indentCount - 1;
  indent(this);
  std::__ostream_insert<char,std::char_traits<char>>(this->ss,")",1);
  return;
}

Assistant:

void ExprWriter::visit(AsmExpr& expr) {
    ss << "__asm__(\"" << expr.inst << "\"" << std::endl;
    indentCount++;
    indent();
    ss << ": ";
    if (!expr.output.empty()) {
        bool first = true;
        for (const auto& out : expr.output) {
            if (!out.second) {
                break;
            }
            if (!first) {
                ss << ", ";
            }
            first = false;

            ss << out.first << " (";
            out.second->accept(*this);
            ss << ")";
        }
    }

    ss << std::endl;
    indent();
    ss << ": ";

    if (!expr.input.empty()) {
        bool first = true;
        for (const auto& in : expr.input) {
            if (!first) {
                ss << ", ";
            }
            first = false;

            ss << in.first << " (";
            in.second->accept(*this);
            ss << ")";
        }
    }

    ss << std::endl;
    indent();
    ss << ": ";

    if (!expr.clobbers.empty()) {
        ss << expr.clobbers;
    }

    ss << std::endl;

    indentCount--;
    indent();
    ss << ")";

}